

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O0

void M3x3_RotateX(double (*input) [3],double degrees,double (*result) [3])

{
  double in_XMM0_Qa;
  double (*m2) [3];
  double (*product) [3];
  double radians;
  double cosvalue;
  double sinvalue;
  double transformationmatrix [3] [3];
  double (*in_stack_ffffffffffffffe0) [3];
  
  M3x3_LoadIdentity((double (*) [3])0x1075c4);
  m2 = (double (*) [3])cos(in_XMM0_Qa * 0.017453292519943295);
  product = (double (*) [3])sin(in_XMM0_Qa * 0.017453292519943295);
  M3x3_MulMatrix(in_stack_ffffffffffffffe0,m2,product);
  return;
}

Assistant:

void M3x3_RotateX(double input[3][3], double degrees, double result[3][3])
{
	double 	transformationmatrix[3][3];
  	double  sinvalue, cosvalue, radians;

    M3x3_LoadIdentity(transformationmatrix);

	radians = degrees * (M_PI/180.0);
	cosvalue = cos(radians);
	sinvalue = sin(radians);

	transformationmatrix[1][1] =  cosvalue;
	transformationmatrix[1][2] = -sinvalue;
	transformationmatrix[2][1] =  sinvalue;
	transformationmatrix[2][2] =  cosvalue;

	M3x3_MulMatrix(transformationmatrix, input, result);
}